

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O1

void __thiscall spatial_region::update_energy_deleted(spatial_region *this,particle *a)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar7._0_8_ = (this->dx * 8.2e-14 * this->dy * this->dz * 11148500000000.0 * lambda) /
                 248.05021344239853;
  auVar7._8_8_ = 0;
  dVar1 = a->cmr;
  if ((dVar1 == -1.0) && (!NAN(dVar1))) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->energy_e_deleted;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (a->g + -1.0) * a->q;
    auVar7 = vfnmadd213sd_fma(auVar7,auVar8,auVar3);
    this->energy_e_deleted = auVar7._0_8_;
    return;
  }
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->energy_p_deleted;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (a->g + -1.0) * a->q;
    auVar7 = vfmadd213sd_fma(auVar7,auVar9,auVar4);
    this->energy_p_deleted = auVar7._0_8_;
    return;
  }
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this->energy_ph_deleted;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = a->q * a->g;
    auVar7 = vfmadd213sd_fma(auVar7,auVar10,auVar5);
    this->energy_ph_deleted = auVar7._0_8_;
    return;
  }
  if (0 < (long)this->n_ion_populations) {
    lVar6 = 0;
    do {
      dVar2 = this->icmr[lVar6];
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        this->ienergy_deleted[lVar6] =
             (auVar7._0_8_ * (a->g + -1.0) * a->q) / dVar2 + this->ienergy_deleted[lVar6];
        return;
      }
      lVar6 = lVar6 + 1;
    } while (this->n_ion_populations != lVar6);
  }
  return;
}

Assistant:

void spatial_region::update_energy_deleted(particle* a)
{
    double norm = 8.2e-14*dx*dy*dz*1.11485e13*lambda/(8*PI*PI*PI); // energy in Joules
    if (a->cmr == -1)
    {
        spatial_region::energy_e_deleted -= a->q * (a->g - 1) * norm; // energy should be positive in file
    }
    else if (a->cmr == 1)
    {
        spatial_region::energy_p_deleted += a->q * (a->g - 1) * norm;
    }
    else if (a->cmr == 0)
    {
        spatial_region::energy_ph_deleted += a->q * a->g * norm;
    }
    else
    {
        for (int j=0; j<n_ion_populations; ++j)
        {
            if (a->cmr == icmr[j])
            {
                spatial_region::ienergy_deleted[j] += a->q * (a->g - 1) * norm / icmr[j];
                break;
            }
        }
    }
}